

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O3

void __thiscall CubicInterpolation::print(CubicInterpolation *this,ostream *out,string *s)

{
  long lVar1;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,(s->_M_dataplus)._M_p,s->_M_string_length);
  lVar1 = 0;
  do {
    Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                          ((long)this->coeffs_[0].
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_19,1);
  return;
}

Assistant:

void CubicInterpolation::print(std::ostream& out, const std::string& s) const {
  out << s;
  for (const auto& c : coeffs_) {
    out << c;
  }
  out << '\n';
}